

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_builder.hpp
# Opt level: O0

vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
* __thiscall
pico_tree::internal::
build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,128ul>
::operator()(build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_128UL>
             *this,space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>_>
                   space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule,size_t forest_size)

{
  undefined8 in_RDX;
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>_>
  in_RDI;
  ulong in_stack_00000008;
  kd_tree_data_type t;
  space_type s;
  point<float,_128UL> r;
  size_t i;
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  *trees;
  value_type *__x;
  kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>
  *in_stack_fffffffffffff2d8;
  kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>
  *in_stack_fffffffffffff2e0;
  size_type in_stack_fffffffffffff2f8;
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  *in_stack_fffffffffffff300;
  rotation_type *in_stack_fffffffffffff310;
  space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>_>
  in_stack_fffffffffffff318;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *in_stack_fffffffffffff798;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_stack_fffffffffffff7a0;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_fffffffffffff7a8;
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_128UL>
  *in_stack_fffffffffffff7b0;
  space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
  in_stack_fffffffffffff7b8;
  space_wrapper<pico_tree::internal::matrix_space<float,_128UL>_> local_6d0 [1104];
  undefined8 local_280;
  space_type local_278;
  undefined8 local_258;
  undefined1 local_250 [512];
  ulong local_50;
  undefined1 local_31;
  undefined8 local_10;
  
  local_31 = 0;
  local_10 = in_RDX;
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  ::vector((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
            *)0x11d529);
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  ::reserve(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
  for (local_50 = 0; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
    local_258 = local_10;
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>::
    random_rotation<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,128ul>,std::allocator<std::array<float,128ul>>>const>>>
              (in_RDI);
    local_280 = local_10;
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>::
    rotate_space<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,128ul>,std::allocator<std::array<float,128ul>>>const>>>
              (in_stack_fffffffffffff310,in_stack_fffffffffffff318);
    space_wrapper<pico_tree::internal::matrix_space<float,_128UL>_>::space_wrapper
              (local_6d0,&local_278);
    build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,128ul>
    ::operator()(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7a8,
                 in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    memcpy(&stack0xfffffffffffff2d0,local_250,0x200);
    __x = (value_type *)&stack0xfffffffffffff4d0;
    matrix_space<float,_128UL>::matrix_space
              ((matrix_space<float,_128UL> *)in_RDI.space_,(matrix_space<float,_128UL> *)__x);
    kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>::kd_tree_data
              (in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
    std::
    vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
    ::push_back((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
                 *)in_RDI.space_,__x);
    rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>::
    ~rkd_tree_hh_data((rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>
                       *)in_RDI.space_);
    kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>::~kd_tree_data
              ((kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL> *)
               in_RDI.space_);
    matrix_space<float,_128UL>::~matrix_space((matrix_space<float,_128UL> *)0x11d67f);
  }
  return (vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
          *)in_RDI.space_;
}

Assistant:

std::vector<rkd_tree_data_type> operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const& rule,
      size_t forest_size) {
    assert(forest_size > 0);

    using space_wrapper_type = typename rkd_tree_data_type::space_wrapper_type;
    using build_kd_tree_type = build_kd_tree<kd_tree_data_type, Dim_>;

    std::vector<rkd_tree_data_type> trees;
    trees.reserve(forest_size);
    for (std::size_t i = 0; i < forest_size; ++i) {
      auto r = rkd_tree_data_type::random_rotation(space);
      auto s = rkd_tree_data_type::rotate_space(r, space);
      auto t = build_kd_tree_type()(
          space_wrapper_type(s), stop_condition, start_bounds, rule);
      trees.push_back({std::move(r), std::move(s), std::move(t)});
    }
    return trees;
  }